

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O2

void TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse_Parse<(TTD::NSLogEvents::EventKind)36,1ul>
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  JsRTVarsArgumentAction_InternalUse<1UL> *pJVar1;
  TTDVar pvVar2;
  
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)36>
                     (evt);
  (*reader->_vptr_FileReader[3])(reader,0x12,1);
  pvVar2 = NSSnapValues::ParseTTDVar(false,reader);
  pJVar1->Result = pvVar2;
  pvVar2 = NSSnapValues::ParseTTDVar(true,reader);
  pJVar1->VarArray[0] = pvVar2;
  return;
}

Assistant:

void JsRTVarsArgumentAction_InternalUse_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTVarsArgumentAction_InternalUse<count>* vAction = GetInlineEventDataAs<JsRTVarsArgumentAction_InternalUse<count>, tag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            vAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            if(count == 1)
            {
                vAction->VarArray[0] = NSSnapValues::ParseTTDVar(true, reader);
            }
            else
            {
                reader->ReadSequenceStart_WDefaultKey(true);
                for(size_t i = 0; i < count; ++i)
                {
                    vAction->VarArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
                }
                reader->ReadSequenceEnd();
            }
        }